

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  
  bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(s,(char (*) [5])0x4bcf84);
  if ((!bVar1) &&
     (bVar1 = cmHasLiteralSuffix<std::__cxx11::string,6ul>(s,(char (*) [6])0x4d6690), !bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
    return __return_storage_ptr__;
  }
  cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}